

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef simplify_intmul_k(jit_State *J,int32_t k)

{
  int iVar1;
  TRef TVar2;
  uint in_ESI;
  long in_RDI;
  undefined4 unaff_retaddr;
  int32_t in_stack_fffffffffffffffc;
  uint uVar3;
  
  if (in_ESI == 1) {
    uVar3 = (uint)*(ushort *)(in_RDI + 0x98);
  }
  else if ((in_ESI & in_ESI - 1) == 0) {
    *(undefined1 *)(in_RDI + 0x9d) = 0x23;
    iVar1 = 0x1f;
    if (in_ESI != 0) {
      for (; in_ESI >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    TVar2 = lj_ir_kint((jit_State *)CONCAT44(k,unaff_retaddr),in_stack_fffffffffffffffc);
    *(short *)(in_RDI + 0x9a) = (short)TVar2;
    uVar3 = 1;
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static TRef simplify_intmul_k(jit_State *J, int32_t k)
{
  /* Note: many more simplifications are possible, e.g. 2^k1 +- 2^k2.
  ** But this is mainly intended for simple address arithmetic.
  ** Also it's easier for the backend to optimize the original multiplies.
  */
  if (k == 1) {  /* i * 1 ==> i */
    return LEFTFOLD;
  } else if ((k & (k-1)) == 0) {  /* i * 2^k ==> i << k */
    fins->o = IR_BSHL;
    fins->op2 = lj_ir_kint(J, lj_fls((uint32_t)k));
    return RETRYFOLD;
  }
  return NEXTFOLD;
}